

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_tag.cpp
# Opt level: O3

void __thiscall despot::BaseTag::~BaseTag(BaseTag *this)

{
  pointer piVar1;
  pointer ppTVar2;
  pointer pCVar3;
  
  *(undefined ***)this = &PTR__BaseTag_0011f430;
  *(undefined ***)&this->super_BeliefMDP = &PTR__BaseTag_0011f560;
  *(undefined ***)&this->super_StateIndexer = &PTR__BaseTag_0011f668;
  *(undefined ***)&this->super_StatePolicy = &PTR__BaseTag_0011f6a0;
  *(undefined ***)&this->super_MMAPInferencer = &PTR__BaseTag_0011f6c8;
  piVar1 = (this->default_action_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar1 != (pointer)0x0) {
    operator_delete(piVar1,(long)(this->default_action_).
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)piVar1);
  }
  MemoryPool<despot::TagState>::~MemoryPool(&this->memory_pool_);
  std::
  vector<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
  ::~vector(&this->transition_probabilities_);
  piVar1 = (this->opp_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar1 != (pointer)0x0) {
    operator_delete(piVar1,(long)(this->opp_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)piVar1);
  }
  piVar1 = (this->rob_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar1 != (pointer)0x0) {
    operator_delete(piVar1,(long)(this->rob_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)piVar1);
  }
  ppTVar2 = (this->states_).
            super__Vector_base<despot::TagState_*,_std::allocator<despot::TagState_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppTVar2 != (pointer)0x0) {
    operator_delete(ppTVar2,(long)(this->states_).
                                  super__Vector_base<despot::TagState_*,_std::allocator<despot::TagState_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppTVar2
                   );
  }
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&(this->floor_).dist_);
  pCVar3 = (this->floor_).cells_.super__Vector_base<despot::Coord,_std::allocator<despot::Coord>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (pCVar3 != (pointer)0x0) {
    operator_delete(pCVar3,(long)(this->floor_).cells_.
                                 super__Vector_base<despot::Coord,_std::allocator<despot::Coord>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pCVar3);
  }
  despot::MMAPInferencer::~MMAPInferencer(&this->super_MMAPInferencer);
  despot::StatePolicy::~StatePolicy(&this->super_StatePolicy);
  despot::StateIndexer::~StateIndexer(&this->super_StateIndexer);
  despot::BeliefMDP::~BeliefMDP(&this->super_BeliefMDP);
  despot::MDP::~MDP(&this->super_MDP);
  return;
}

Assistant:

BaseTag::~BaseTag() {
}